

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O0

void __thiscall
duckdb::BinaryAggregateHeap<long,_double,_duckdb::GreaterThan>::Insert
          (BinaryAggregateHeap<long,_double,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,
          long *key,double *value)

{
  bool bVar1;
  double *in_RCX;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_> *in_RDX;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_> *in_RSI;
  ulong *in_RDI;
  _func_bool_pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_>_ptr_pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_>_ptr
  *unaff_retaddr;
  
  if (in_RDI[2] < *in_RDI) {
    HeapEntry<long>::Assign
              ((HeapEntry<long> *)(in_RDI[1] + in_RDI[2] * 0x10),(ArenaAllocator *)in_RSI,
               (long *)in_RDX);
    HeapEntry<double>::Assign
              ((HeapEntry<double> *)(in_RDI[1] + in_RDI[2] * 0x10 + 8),(ArenaAllocator *)in_RSI,
               in_RCX);
    in_RDI[2] = in_RDI[2] + 1;
    std::
    push_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>*,bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>const&)>
              ((pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_> *)key,
               (pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_> *)value,unaff_retaddr);
  }
  else {
    bVar1 = GreaterThan::Operation<long>((long *)in_RDX,(long *)in_RDI[1]);
    if (bVar1) {
      std::
      pop_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>*,bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>const&)>
                (in_RSI,in_RDX,
                 (_func_bool_pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_>_ptr_pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_>_ptr
                  *)in_RCX);
      HeapEntry<long>::Assign
                ((HeapEntry<long> *)(in_RDI[1] + (in_RDI[2] - 1) * 0x10),(ArenaAllocator *)in_RSI,
                 (long *)in_RDX);
      HeapEntry<double>::Assign
                ((HeapEntry<double> *)(in_RDI[1] + (in_RDI[2] - 1) * 0x10 + 8),
                 (ArenaAllocator *)in_RSI,in_RCX);
      std::
      push_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>*,bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>const&)>
                ((pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_> *)key,
                 (pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_> *)value,unaff_retaddr);
    }
  }
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}